

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_trc.c
# Opt level: O0

void Curl_infof(Curl_easy *data,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_8f8 [16];
  undefined8 local_8e8;
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined8 local_8b8;
  undefined8 local_8a8;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  char local_848 [8];
  char buffer [2050];
  undefined1 local_38 [4];
  int len;
  va_list ap;
  char *fmt_local;
  Curl_easy *data_local;
  
  if (in_AL != '\0') {
    local_8c8 = in_XMM0_Qa;
    local_8b8 = in_XMM1_Qa;
    local_8a8 = in_XMM2_Qa;
    local_898 = in_XMM3_Qa;
    local_888 = in_XMM4_Qa;
    local_878 = in_XMM5_Qa;
    local_868 = in_XMM6_Qa;
    local_858 = in_XMM7_Qa;
  }
  if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
    ap[0].overflow_arg_area = local_8f8;
    ap[0]._0_8_ = &stack0x00000008;
    len = 0x30;
    local_38 = (undefined1  [4])0x10;
    local_8e8 = in_RDX;
    local_8e0 = in_RCX;
    local_8d8 = in_R8;
    local_8d0 = in_R9;
    iVar1 = curl_mvsnprintf(local_848,0x800,fmt,(__va_list_tag *)local_38);
    local_848[iVar1] = '\n';
    local_848[iVar1 + 1] = '\0';
    Curl_debug(data,CURLINFO_TEXT,local_848,(long)(iVar1 + 1));
  }
  return;
}

Assistant:

void Curl_infof(struct Curl_easy *data, const char *fmt, ...)
{
  DEBUGASSERT(!strchr(fmt, '\n'));
  if(data && data->set.verbose) {
    va_list ap;
    int len;
    char buffer[MAXINFO + 2];
    va_start(ap, fmt);
    len = mvsnprintf(buffer, MAXINFO, fmt, ap);
    va_end(ap);
    buffer[len++] = '\n';
    buffer[len] = '\0';
    Curl_debug(data, CURLINFO_TEXT, buffer, len);
  }
}